

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall CConnman::MaybePickPreferredNetwork(CConnman *this,optional<Network> *network)

{
  Network net;
  bool bVar1;
  size_t sVar2;
  _Optional_payload_base<Network> net_00;
  long lVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock76;
  array<Network,_5UL> nets;
  undefined1 local_d0 [16];
  ChaCha20 local_c0;
  Network local_48 [6];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48[0] = NET_IPV4;
  local_48[1] = NET_IPV6;
  local_48[2] = NET_ONION;
  local_48[3] = NET_I2P;
  local_48[4] = 5;
  FastRandomContext::FastRandomContext((FastRandomContext *)local_d0,false);
  std::shuffle<Network*,FastRandomContext>(local_48,local_48 + 5,(FastRandomContext *)local_d0);
  ChaCha20::~ChaCha20(&local_c0);
  local_d0._0_8_ = &this->m_nodes_mutex;
  local_d0[8] = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_d0);
  lVar3 = 0;
  do {
    net = *(Network *)((long)local_48 + lVar3);
    bVar1 = ReachableNets::Contains(&g_reachable_nets,net);
    if ((bVar1) && ((this->m_network_conn_counts)._M_elems[net] == 0)) {
      net_00 = (_Optional_payload_base<Network>)((ulong)net | 0x100000000);
      sVar2 = AddrMan::Size(this->addrman,(optional<Network>)net_00,(optional<bool>)0x0);
      if (sVar2 != 0) {
        (network->super__Optional_base<Network,_true,_true>)._M_payload.
        super__Optional_payload_base<Network> = net_00;
        bVar1 = true;
        goto LAB_008becff;
      }
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x14);
  bVar1 = false;
LAB_008becff:
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_d0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::MaybePickPreferredNetwork(std::optional<Network>& network)
{
    std::array<Network, 5> nets{NET_IPV4, NET_IPV6, NET_ONION, NET_I2P, NET_CJDNS};
    std::shuffle(nets.begin(), nets.end(), FastRandomContext());

    LOCK(m_nodes_mutex);
    for (const auto net : nets) {
        if (g_reachable_nets.Contains(net) && m_network_conn_counts[net] == 0 && addrman.Size(net) != 0) {
            network = net;
            return true;
        }
    }

    return false;
}